

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

void burstsort2_sampling_superalphabet_brodnik(uchar **strings,size_t n)

{
  byte bVar1;
  ulong uVar2;
  ostream *poVar3;
  TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *root;
  pointer ppvVar4;
  undefined8 *puVar5;
  TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *this;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  ulong uVar6;
  long lVar7;
  uint index;
  byte *pbVar9;
  _func_void_uchar_ptr_ptr_int_int *p_Var8;
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"pseudo_sample",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(): sampling ",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," strings ...\n",0xd);
  root = (TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *)operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (n != 0) {
    lVar7 = 2000;
    uVar6 = 0;
    do {
      if (strings[uVar6] == (uchar *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      pbVar9 = strings[uVar6] + 1;
      this = root;
      while (pbVar9[-1] != 0) {
        bVar1 = *pbVar9;
        in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(ulong)bVar1;
        if (bVar1 == 0) break;
        index = (uint)CONCAT11(pbVar9[-1],bVar1);
        p_Var8 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)index;
        ppvVar4 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                 ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)ppvVar4 >> 3);
        if (in_RCX < (_func_void_uchar_ptr_ptr_int_int *)(ulong)(index + 1)) {
          std::vector<void_*,_std::allocator<void_*>_>::resize
                    (&this->_buckets,(size_type)(ulong)(index + 1));
          ppvVar4 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                   ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar4 >> 3);
        }
        if ((in_RCX <= p_Var8) || (((ulong)ppvVar4[(long)p_Var8] & 1) == 0)) {
          puVar5 = (undefined8 *)operator_new(0x18);
          *puVar5 = 0;
          puVar5[1] = 0;
          puVar5[2] = 0;
          *(undefined8 **)
           ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + (ulong)(index * 8)) = puVar5;
          ppvVar4 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar2 = *(ulong *)((long)ppvVar4 + (ulong)(index * 8));
          if (uVar2 == 0) {
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0x5c,"void make_trie(void *&)");
          }
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(uVar2 | 1);
          ppvVar4[(long)p_Var8] = in_RCX;
          lVar7 = lVar7 + -1;
          if (lVar7 == 0) goto LAB_00211795;
        }
        this = TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_>::get_node(this,index);
        pbVar9 = pbVar9 + 2;
        if (this == (TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *)0x0) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0xd9,
                        "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned short, BucketT = vector_brodnik<unsigned char *>]"
                       );
        }
      }
      uVar6 = uVar6 + 0x2000;
    } while (uVar6 < n);
  }
LAB_00211795:
  insert<32768u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_short>,unsigned_short>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_short>
            (root,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_superalphabet_brodnik(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef vector_brodnik<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<32768, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}